

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
StrictMockProblemBuilder::StrictMockProblemBuilder(StrictMockProblemBuilder *this,TestSolver *s)

{
  FunctionMocker<StrictMockProblemBuilder_&()> *this_00;
  TypedExpectation<StrictMockProblemBuilder_&()> *this_01;
  linked_ptr<testing::ActionInterface<StrictMockProblemBuilder_&()>_> local_28;
  
  testing::StrictMock<MockProblemBuilder>::StrictMock(&this->super_StrictMock<MockProblemBuilder>);
  (this->super_StrictMock<MockProblemBuilder>)._vptr_StrictMock =
       (_func_int **)&PTR__StrictMockProblemBuilder_0028d1c0;
  this_00 = &this->gmock0_problem_111;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  (this->gmock0_problem_111).super_FunctionMockerBase<StrictMockProblemBuilder_&()>.current_spec_.
  function_mocker_ = &this_00->super_FunctionMockerBase<StrictMockProblemBuilder_&()>;
  (this->gmock0_problem_111).super_FunctionMockerBase<StrictMockProblemBuilder_&()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002914b0;
  s->builder = this;
  if (s->call_problem_ == true) {
    testing::internal::UntypedFunctionMockerBase::RegisterOwner
              ((UntypedFunctionMockerBase *)this_00,this);
    this_01 = testing::internal::MockSpec<StrictMockProblemBuilder_&()>::InternalExpectedAt
                        (&(this->gmock0_problem_111).
                          super_FunctionMockerBase<StrictMockProblemBuilder_&()>.current_spec_,
                         "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc"
                         ,0x6c,"*this","problem()");
    local_28.value_ = (ActionInterface<StrictMockProblemBuilder_&()> *)operator_new(0x10);
    (local_28.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00293138;
    local_28.value_[1]._vptr_ActionInterface = (_func_int **)this;
    local_28.link_.next_ = &local_28.link_;
    testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::WillOnce
              (this_01,(Action<StrictMockProblemBuilder_&()> *)&local_28);
    testing::internal::linked_ptr<testing::ActionInterface<StrictMockProblemBuilder_&()>_>::
    ~linked_ptr(&local_28);
  }
  return;
}

Assistant:

explicit StrictMockProblemBuilder(TestSolver &s) {
    s.builder = this;
    if (s.call_problem())
      EXPECT_CALL(*this, problem()).WillOnce(testing::ReturnRef(*this));
  }